

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall List::on_click(List *this,int mx,int my)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  Theme *pTVar5;
  size_type sVar6;
  int in_EDX;
  long *in_RDI;
  uint i;
  Theme *theme;
  
  uVar4 = (**(code **)(*in_RDI + 0x80))();
  if ((uVar4 & 1) == 0) {
    pTVar5 = Dialog::get_theme((Dialog *)in_RDI[3]);
    iVar1 = *(int *)((long)in_RDI + 0x24);
    iVar2 = al_get_font_line_height(pTVar5->font);
    uVar3 = (in_EDX - iVar1) / iVar2;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 7));
    if (uVar3 < sVar6) {
      *(uint *)(in_RDI + 10) = uVar3;
      Dialog::request_draw((Dialog *)in_RDI[3]);
    }
  }
  return;
}

Assistant:

void List::on_click(int mx, int my)
{
   if (is_disabled())
      return;

   const Theme & theme = dialog->get_theme();
   unsigned int i = (my - this->y1) / al_get_font_line_height(theme.font);
   if (i < this->items.size()) {
      this->selected_item = i;
      dialog->request_draw();
   }

   (void)mx;
   (void)my;
}